

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fftcep.cc
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  bool bVar2;
  byte bVar3;
  ostream *poVar4;
  int *actual_read_size;
  long lVar5;
  vector<double,_std::allocator<double>_> *sequence_to_read;
  long in_RSI;
  int in_EDI;
  ostringstream error_message_17;
  ostringstream error_message_16;
  ostringstream error_message_15;
  ostringstream error_message_14;
  vector<double,_std::allocator<double>_> output;
  vector<double,_std::allocator<double>_> processed_input;
  vector<double,_std::allocator<double>_> input;
  int output_length;
  int input_length;
  ostringstream error_message_13;
  Buffer buffer_for_cepstral_analysis;
  FastFourierTransformCepstralAnalysis analysis;
  ostringstream error_message_12;
  Buffer buffer_for_spectral_analysis;
  WaveformToSpectrum waveform_to_spectrum;
  ostringstream error_message_11;
  SpectrumToSpectrum spectrum_to_spectrum;
  istream *input_stream;
  ostringstream error_message_10;
  ifstream ifs;
  ostringstream error_message_9;
  char *input_file;
  ostringstream error_message_8;
  int num_input_files;
  ostringstream error_message_7;
  int half_fft_length;
  ostringstream error_message_6;
  ostringstream error_message_5;
  ostringstream error_message_4;
  int tmp;
  int max;
  int min;
  ostringstream error_message_3;
  ostringstream error_message_2;
  ostringstream error_message_1;
  ostringstream error_message;
  int option_char;
  double relative_floor_in_decibels;
  double epsilon;
  InputFormats input_format;
  double acceleration_factor;
  int num_iteration;
  int num_order;
  int fft_length;
  option *in_stack_ffffffffffffd898;
  Buffer *buffer;
  FastFourierTransformCepstralAnalysis *in_stack_ffffffffffffd8a0;
  undefined7 in_stack_ffffffffffffd8a8;
  undefined1 in_stack_ffffffffffffd8af;
  WaveformToSpectrum *in_stack_ffffffffffffd8b0;
  undefined7 in_stack_ffffffffffffd8b8;
  undefined1 in_stack_ffffffffffffd8bf;
  Buffer *in_stack_ffffffffffffd8c0;
  allocator *paVar6;
  undefined7 in_stack_ffffffffffffd8c8;
  undefined1 in_stack_ffffffffffffd8cf;
  int *in_stack_ffffffffffffd8d0;
  int in_stack_ffffffffffffd8d8;
  undefined2 in_stack_ffffffffffffd8dc;
  undefined1 in_stack_ffffffffffffd8de;
  undefined1 in_stack_ffffffffffffd8df;
  FastFourierTransformCepstralAnalysis *in_stack_ffffffffffffd8e0;
  undefined8 in_stack_ffffffffffffd8e8;
  SpectrumToSpectrum *this;
  WaveformToSpectrum *in_stack_ffffffffffffd8f0;
  int local_26ec;
  undefined7 in_stack_ffffffffffffd940;
  undefined1 in_stack_ffffffffffffd947;
  vector<double,_std::allocator<double>_> *cepstrum;
  undefined4 in_stack_ffffffffffffd950;
  undefined4 in_stack_ffffffffffffd954;
  InputOutputFormats output_format;
  FastFourierTransformCepstralAnalysis *in_stack_ffffffffffffd958;
  SpectrumToSpectrum *in_stack_ffffffffffffd960;
  char *local_2670;
  bool local_261a;
  bool local_25f2;
  byte local_25aa;
  bool local_257a;
  ostringstream *in_stack_ffffffffffffda88;
  allocator *in_stack_ffffffffffffda90;
  bool local_254a;
  bool local_251a;
  undefined1 local_24d1 [33];
  ostringstream local_24b0 [383];
  undefined1 local_2331 [33];
  ostringstream local_2310 [383];
  allocator local_2191;
  string local_2190 [32];
  ostringstream local_2170 [383];
  allocator local_1ff1;
  string local_1ff0 [32];
  ostringstream local_1fd0 [383];
  SpectrumToSpectrum local_1e51;
  int local_1df4;
  int local_1df0;
  allocator local_1de9;
  string local_1de8 [32];
  ostringstream local_1dc8 [552];
  FastFourierTransformCepstralAnalysis local_1ba0;
  allocator local_1aa1;
  string local_1aa0 [32];
  ostringstream local_1a80 [815];
  allocator local_1751;
  string local_1750 [32];
  ostringstream local_1730 [376];
  SpectrumToSpectrum local_15b8;
  vector<double,_std::allocator<double>_> *local_1570;
  undefined4 local_1568;
  allocator local_1561;
  string local_1560 [32];
  ostringstream local_1540 [376];
  vector<double,_std::allocator<double>_> local_13c8 [21];
  allocator local_11b9;
  string local_11b8 [32];
  ostringstream local_1198 [376];
  char *local_1020;
  allocator local_1011;
  string local_1010 [32];
  ostringstream local_ff0 [376];
  int local_e78;
  allocator local_e71;
  string local_e70 [32];
  ostringstream local_e50 [376];
  int local_cd8;
  allocator local_cd1;
  string local_cd0 [32];
  ostringstream local_cb0 [383];
  allocator local_b31;
  string local_b30 [39];
  allocator local_b09;
  string local_b08 [32];
  ostringstream local_ae8 [383];
  allocator local_969;
  string local_968 [39];
  allocator local_941;
  string local_940 [32];
  ostringstream local_920 [383];
  allocator local_7a1;
  string local_7a0 [32];
  int local_780;
  undefined4 local_77c;
  undefined4 local_778;
  allocator local_771;
  string local_770 [32];
  ostringstream local_750 [383];
  allocator local_5d1;
  string local_5d0 [39];
  allocator local_5a9;
  string local_5a8 [32];
  ostringstream local_588 [383];
  allocator local_409;
  string local_408 [39];
  allocator local_3e1;
  string local_3e0 [32];
  ostringstream local_3c0 [383];
  allocator local_241;
  string local_240 [39];
  allocator local_219;
  string local_218 [32];
  ostringstream local_1f8 [399];
  allocator local_69;
  string local_68 [36];
  int local_44;
  double local_40;
  double local_38;
  int local_2c;
  double local_28;
  int local_1c;
  int local_18;
  int local_14;
  long local_10;
  int local_8;
  int local_4;
  
  local_4 = 0;
  local_14 = 0x100;
  local_18 = 0x19;
  local_1c = 0;
  local_28 = 0.0;
  local_2c = 4;
  local_38 = 0.0;
  local_40 = -1.79769313486232e+308;
  local_10 = in_RSI;
  local_8 = in_EDI;
  while (local_44 = ya_getopt_long((int)((ulong)in_stack_ffffffffffffd8b0 >> 0x20),
                                   (char **)CONCAT17(in_stack_ffffffffffffd8af,
                                                     in_stack_ffffffffffffd8a8),
                                   (char *)in_stack_ffffffffffffd8a0,in_stack_ffffffffffffd898,
                                   (int *)0x1048e9), pcVar1 = ya_optarg, local_44 != -1) {
    switch(local_44) {
    case 0x45:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_b30,pcVar1,&local_b31);
      bVar2 = sptk::ConvertStringToDouble
                        ((string *)CONCAT17(in_stack_ffffffffffffd8af,in_stack_ffffffffffffd8a8),
                         (double *)in_stack_ffffffffffffd8a0);
      local_261a = !bVar2 || 0.0 <= local_40;
      std::__cxx11::string::~string(local_b30);
      std::allocator<char>::~allocator((allocator<char> *)&local_b31);
      if (local_261a) {
        std::__cxx11::ostringstream::ostringstream(local_cb0);
        std::operator<<((ostream *)local_cb0,
                        "The argument for the -E option must be a negative number");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_cd0,"fftcep",&local_cd1);
        sptk::PrintErrorMessage((string *)in_stack_ffffffffffffda90,in_stack_ffffffffffffda88);
        std::__cxx11::string::~string(local_cd0);
        std::allocator<char>::~allocator((allocator<char> *)&local_cd1);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_cb0);
        return local_4;
      }
      break;
    default:
      anon_unknown.dwarf_1741::PrintUsage((ostream *)in_stack_ffffffffffffd8f0);
      return 1;
    case 0x61:
      in_stack_ffffffffffffda90 = &local_5d1;
      in_stack_ffffffffffffda88 = (ostringstream *)ya_optarg;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_5d0,(char *)in_stack_ffffffffffffda88,in_stack_ffffffffffffda90);
      bVar2 = sptk::ConvertStringToDouble
                        ((string *)CONCAT17(in_stack_ffffffffffffd8af,in_stack_ffffffffffffd8a8),
                         (double *)in_stack_ffffffffffffd8a0);
      local_257a = !bVar2 || local_28 < 0.0;
      std::__cxx11::string::~string(local_5d0);
      std::allocator<char>::~allocator((allocator<char> *)&local_5d1);
      if (local_257a) {
        std::__cxx11::ostringstream::ostringstream(local_750);
        poVar4 = std::operator<<((ostream *)local_750,"The argument for the -a option must be a ");
        std::operator<<(poVar4,"non-negative number");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_770,"fftcep",&local_771);
        sptk::PrintErrorMessage((string *)in_stack_ffffffffffffda90,in_stack_ffffffffffffda88);
        std::__cxx11::string::~string(local_770);
        std::allocator<char>::~allocator((allocator<char> *)&local_771);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_750);
        return local_4;
      }
      break;
    case 0x65:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_968,pcVar1,&local_969);
      bVar2 = sptk::ConvertStringToDouble
                        ((string *)CONCAT17(in_stack_ffffffffffffd8af,in_stack_ffffffffffffd8a8),
                         (double *)in_stack_ffffffffffffd8a0);
      local_25f2 = !bVar2 || local_38 <= 0.0;
      std::__cxx11::string::~string(local_968);
      std::allocator<char>::~allocator((allocator<char> *)&local_969);
      if (local_25f2) {
        std::__cxx11::ostringstream::ostringstream(local_ae8);
        std::operator<<((ostream *)local_ae8,
                        "The argument for the -e option must be a positive number");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_b08,"fftcep",&local_b09);
        sptk::PrintErrorMessage((string *)in_stack_ffffffffffffda90,in_stack_ffffffffffffda88);
        std::__cxx11::string::~string(local_b08);
        std::allocator<char>::~allocator((allocator<char> *)&local_b09);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_ae8);
        return local_4;
      }
      break;
    case 0x68:
      anon_unknown.dwarf_1741::PrintUsage((ostream *)in_stack_ffffffffffffd8f0);
      return 0;
    case 0x69:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_408,pcVar1,&local_409);
      bVar2 = sptk::ConvertStringToInteger
                        ((string *)CONCAT17(in_stack_ffffffffffffd8af,in_stack_ffffffffffffd8a8),
                         (int *)in_stack_ffffffffffffd8a0);
      local_254a = !bVar2 || local_1c < 0;
      std::__cxx11::string::~string(local_408);
      std::allocator<char>::~allocator((allocator<char> *)&local_409);
      if (local_254a) {
        std::__cxx11::ostringstream::ostringstream(local_588);
        poVar4 = std::operator<<((ostream *)local_588,"The argument for the -i option must be a ");
        std::operator<<(poVar4,"non-negative integer");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_5a8,"fftcep",&local_5a9);
        sptk::PrintErrorMessage((string *)in_stack_ffffffffffffda90,in_stack_ffffffffffffda88);
        std::__cxx11::string::~string(local_5a8);
        std::allocator<char>::~allocator((allocator<char> *)&local_5a9);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_588);
        return local_4;
      }
      break;
    case 0x6c:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_68,pcVar1,&local_69);
      bVar2 = sptk::ConvertStringToInteger
                        ((string *)CONCAT17(in_stack_ffffffffffffd8af,in_stack_ffffffffffffd8a8),
                         (int *)in_stack_ffffffffffffd8a0);
      std::__cxx11::string::~string(local_68);
      std::allocator<char>::~allocator((allocator<char> *)&local_69);
      if (((bVar2 ^ 0xffU) & 1) != 0) {
        std::__cxx11::ostringstream::ostringstream(local_1f8);
        std::operator<<((ostream *)local_1f8,"The argument for the -l option must be an integer");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_218,"fftcep",&local_219);
        sptk::PrintErrorMessage((string *)in_stack_ffffffffffffda90,in_stack_ffffffffffffda88);
        std::__cxx11::string::~string(local_218);
        std::allocator<char>::~allocator((allocator<char> *)&local_219);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_1f8);
        return local_4;
      }
      break;
    case 0x6d:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_240,pcVar1,&local_241);
      bVar2 = sptk::ConvertStringToInteger
                        ((string *)CONCAT17(in_stack_ffffffffffffd8af,in_stack_ffffffffffffd8a8),
                         (int *)in_stack_ffffffffffffd8a0);
      local_251a = !bVar2 || local_18 < 0;
      std::__cxx11::string::~string(local_240);
      std::allocator<char>::~allocator((allocator<char> *)&local_241);
      if (local_251a) {
        std::__cxx11::ostringstream::ostringstream(local_3c0);
        poVar4 = std::operator<<((ostream *)local_3c0,"The argument for the -m option must be a ");
        std::operator<<(poVar4,"non-negative integer");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_3e0,"fftcep",&local_3e1);
        sptk::PrintErrorMessage((string *)in_stack_ffffffffffffda90,in_stack_ffffffffffffda88);
        std::__cxx11::string::~string(local_3e0);
        std::allocator<char>::~allocator((allocator<char> *)&local_3e1);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_3c0);
        return local_4;
      }
      break;
    case 0x71:
      local_778 = 0;
      local_77c = 4;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_7a0,pcVar1,&local_7a1);
      bVar2 = sptk::ConvertStringToInteger
                        ((string *)CONCAT17(in_stack_ffffffffffffd8af,in_stack_ffffffffffffd8a8),
                         (int *)in_stack_ffffffffffffd8a0);
      local_25aa = 1;
      if (bVar2) {
        bVar2 = sptk::IsInRange(local_780,0,4);
        local_25aa = bVar2 ^ 0xff;
      }
      std::__cxx11::string::~string(local_7a0);
      std::allocator<char>::~allocator((allocator<char> *)&local_7a1);
      if ((local_25aa & 1) != 0) {
        std::__cxx11::ostringstream::ostringstream(local_920);
        poVar4 = std::operator<<((ostream *)local_920,
                                 "The argument for the -q option must be an integer ");
        poVar4 = std::operator<<(poVar4,"in the range of ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,0);
        poVar4 = std::operator<<(poVar4," to ");
        std::ostream::operator<<(poVar4,4);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_940,"fftcep",&local_941);
        sptk::PrintErrorMessage((string *)in_stack_ffffffffffffda90,in_stack_ffffffffffffda88);
        std::__cxx11::string::~string(local_940);
        std::allocator<char>::~allocator((allocator<char> *)&local_941);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_920);
        return local_4;
      }
      local_2c = local_780;
    }
  }
  local_cd8 = local_14 / 2;
  if (local_cd8 < local_18) {
    std::__cxx11::ostringstream::ostringstream(local_e50);
    poVar4 = std::operator<<((ostream *)local_e50,"Order of cepstrum ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_18);
    poVar4 = std::operator<<(poVar4," must be equal to or less than half of FFT length ");
    std::ostream::operator<<(poVar4,local_cd8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_e70,"fftcep",&local_e71);
    sptk::PrintErrorMessage((string *)in_stack_ffffffffffffda90,in_stack_ffffffffffffda88);
    std::__cxx11::string::~string(local_e70);
    std::allocator<char>::~allocator((allocator<char> *)&local_e71);
    local_4 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_e50);
    return local_4;
  }
  local_e78 = local_8 - ya_optind;
  if (1 < local_e78) {
    std::__cxx11::ostringstream::ostringstream(local_ff0);
    std::operator<<((ostream *)local_ff0,"Too many input files");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1010,"fftcep",&local_1011);
    sptk::PrintErrorMessage((string *)in_stack_ffffffffffffda90,in_stack_ffffffffffffda88);
    std::__cxx11::string::~string(local_1010);
    std::allocator<char>::~allocator((allocator<char> *)&local_1011);
    local_4 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_ff0);
    return local_4;
  }
  if (local_e78 == 0) {
    local_2670 = (char *)0x0;
  }
  else {
    local_2670 = *(char **)(local_10 + (long)ya_optind * 8);
  }
  local_1020 = local_2670;
  bVar2 = sptk::SetBinaryMode();
  if (!bVar2) {
    std::__cxx11::ostringstream::ostringstream(local_1198);
    std::operator<<((ostream *)local_1198,"Cannot set translation mode");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_11b8,"fftcep",&local_11b9);
    sptk::PrintErrorMessage((string *)in_stack_ffffffffffffda90,in_stack_ffffffffffffda88);
    std::__cxx11::string::~string(local_11b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_11b9);
    local_4 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_1198);
    return local_4;
  }
  std::ifstream::ifstream(local_13c8);
  pcVar1 = local_1020;
  if (local_1020 != (char *)0x0) {
    std::operator|(_S_in,_S_bin);
    std::ifstream::open((char *)local_13c8,(_Ios_Openmode)pcVar1);
    bVar3 = std::ios::fail();
    if ((bVar3 & 1) != 0) {
      std::__cxx11::ostringstream::ostringstream(local_1540);
      poVar4 = std::operator<<((ostream *)local_1540,"Cannot open file ");
      std::operator<<(poVar4,local_1020);
      paVar6 = &local_1561;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1560,"fftcep",paVar6);
      sptk::PrintErrorMessage((string *)in_stack_ffffffffffffda90,in_stack_ffffffffffffda88);
      std::__cxx11::string::~string(local_1560);
      std::allocator<char>::~allocator((allocator<char> *)&local_1561);
      local_4 = 1;
      local_1568 = 1;
      std::__cxx11::ostringstream::~ostringstream(local_1540);
      goto LAB_00106d6a;
    }
  }
  bVar3 = std::ifstream::is_open();
  output_format = CONCAT13(bVar3,(int3)in_stack_ffffffffffffd954);
  if ((bVar3 & 1) == 0) {
    cepstrum = (vector<double,_std::allocator<double>_> *)&std::cin;
  }
  else {
    cepstrum = local_13c8;
  }
  local_1570 = cepstrum;
  sptk::SpectrumToSpectrum::SpectrumToSpectrum
            (in_stack_ffffffffffffd960,(int)((ulong)in_stack_ffffffffffffd958 >> 0x20),
             (InputOutputFormats)in_stack_ffffffffffffd958,output_format,(double)cepstrum,
             (double)CONCAT17(in_stack_ffffffffffffd947,in_stack_ffffffffffffd940));
  if ((local_2c == 4) ||
     (in_stack_ffffffffffffd947 = sptk::SpectrumToSpectrum::IsValid(&local_15b8),
     (bool)in_stack_ffffffffffffd947)) {
    sptk::WaveformToSpectrum::WaveformToSpectrum
              (in_stack_ffffffffffffd8f0,(int)((ulong)in_stack_ffffffffffffd8e8 >> 0x20),
               (int)in_stack_ffffffffffffd8e8,
               (InputOutputFormats)((ulong)in_stack_ffffffffffffd8e0 >> 0x20),
               (double)CONCAT17(in_stack_ffffffffffffd8df,
                                CONCAT16(in_stack_ffffffffffffd8de,
                                         CONCAT24(in_stack_ffffffffffffd8dc,
                                                  in_stack_ffffffffffffd8d8))),
               (double)in_stack_ffffffffffffd8d0);
    sptk::WaveformToSpectrum::Buffer::Buffer((Buffer *)0x1061f9);
    if ((local_2c != 4) ||
       (bVar2 = sptk::WaveformToSpectrum::IsValid((WaveformToSpectrum *)0x10621a), bVar2)) {
      sptk::FastFourierTransformCepstralAnalysis::FastFourierTransformCepstralAnalysis
                (in_stack_ffffffffffffd8e0,
                 CONCAT13(in_stack_ffffffffffffd8df,
                          CONCAT12(in_stack_ffffffffffffd8de,in_stack_ffffffffffffd8dc)),
                 in_stack_ffffffffffffd8d8,(int)((ulong)in_stack_ffffffffffffd8d0 >> 0x20),
                 (double)CONCAT17(in_stack_ffffffffffffd8cf,in_stack_ffffffffffffd8c8));
      sptk::FastFourierTransformCepstralAnalysis::Buffer::Buffer(in_stack_ffffffffffffd8c0);
      bVar2 = sptk::FastFourierTransformCepstralAnalysis::IsValid(&local_1ba0);
      if (bVar2) {
        if (local_2c == 4) {
          local_26ec = local_14;
        }
        else {
          local_26ec = local_14 / 2 + 1;
        }
        local_1df0 = local_26ec;
        local_1df4 = local_18 + 1;
        actual_read_size = (int *)(long)local_26ec;
        std::allocator<double>::allocator((allocator<double> *)0x1065a0);
        std::vector<double,_std::allocator<double>_>::vector
                  ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffd8c0,
                   CONCAT17(in_stack_ffffffffffffd8bf,in_stack_ffffffffffffd8b8),
                   (allocator_type *)in_stack_ffffffffffffd8b0);
        std::allocator<double>::~allocator((allocator<double> *)0x1065c6);
        lVar5 = (long)(local_14 / 2 + 1);
        std::allocator<double>::allocator((allocator<double> *)0x1065f1);
        std::vector<double,_std::allocator<double>_>::vector
                  ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffd8c0,
                   CONCAT17(in_stack_ffffffffffffd8bf,in_stack_ffffffffffffd8b8),
                   (allocator_type *)in_stack_ffffffffffffd8b0);
        std::allocator<double>::~allocator((allocator<double> *)0x106617);
        sequence_to_read = (vector<double,_std::allocator<double>_> *)(long)local_1df4;
        this = &local_1e51;
        std::allocator<double>::allocator((allocator<double> *)0x106636);
        std::vector<double,_std::allocator<double>_>::vector
                  ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffd8c0,
                   CONCAT17(in_stack_ffffffffffffd8bf,in_stack_ffffffffffffd8b8),
                   (allocator_type *)in_stack_ffffffffffffd8b0);
        std::allocator<double>::~allocator((allocator<double> *)0x10665c);
        do {
          buffer = (Buffer *)0x0;
          in_stack_ffffffffffffd8df =
               sptk::ReadStream<double>
                         (SUB81((ulong)lVar5 >> 0x30,0),(int)lVar5,(int)((ulong)this >> 0x20),
                          (int)this,sequence_to_read,
                          (istream *)
                          CONCAT17(in_stack_ffffffffffffd8df,
                                   CONCAT16(in_stack_ffffffffffffd8de,
                                            CONCAT24(in_stack_ffffffffffffd8dc,
                                                     in_stack_ffffffffffffd8d8))),actual_read_size);
          if (!(bool)in_stack_ffffffffffffd8df) {
            local_4 = 0;
            local_1568 = 1;
            goto LAB_00106c8a;
          }
          if (local_2c == 4) {
            in_stack_ffffffffffffd8de =
                 sptk::WaveformToSpectrum::Run
                           (in_stack_ffffffffffffd8b0,
                            (vector<double,_std::allocator<double>_> *)
                            CONCAT17(in_stack_ffffffffffffd8af,in_stack_ffffffffffffd8a8),
                            (vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffd8a0,
                            buffer);
            if (!(bool)in_stack_ffffffffffffd8de) {
              std::__cxx11::ostringstream::ostringstream(local_1fd0);
              std::operator<<((ostream *)local_1fd0,"Failed to transform waveform to spectrum");
              paVar6 = &local_1ff1;
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_1ff0,"fftcep",paVar6);
              sptk::PrintErrorMessage((string *)in_stack_ffffffffffffda90,in_stack_ffffffffffffda88)
              ;
              std::__cxx11::string::~string(local_1ff0);
              std::allocator<char>::~allocator((allocator<char> *)&local_1ff1);
              local_4 = 1;
              local_1568 = 1;
              std::__cxx11::ostringstream::~ostringstream(local_1fd0);
              goto LAB_00106c8a;
            }
          }
          else {
            bVar2 = sptk::SpectrumToSpectrum::Run
                              (this,sequence_to_read,
                               (vector<double,_std::allocator<double>_> *)
                               CONCAT17(in_stack_ffffffffffffd8df,
                                        CONCAT16(in_stack_ffffffffffffd8de,
                                                 CONCAT24(in_stack_ffffffffffffd8dc,
                                                          in_stack_ffffffffffffd8d8))));
            if (!bVar2) {
              std::__cxx11::ostringstream::ostringstream(local_2170);
              std::operator<<((ostream *)local_2170,"Failed to convert spectrum");
              paVar6 = &local_2191;
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_2190,"fftcep",paVar6);
              sptk::PrintErrorMessage((string *)in_stack_ffffffffffffda90,in_stack_ffffffffffffda88)
              ;
              std::__cxx11::string::~string(local_2190);
              std::allocator<char>::~allocator((allocator<char> *)&local_2191);
              local_4 = 1;
              local_1568 = 1;
              std::__cxx11::ostringstream::~ostringstream(local_2170);
              goto LAB_00106c8a;
            }
          }
          bVar2 = sptk::FastFourierTransformCepstralAnalysis::Run
                            (in_stack_ffffffffffffd958,
                             (vector<double,_std::allocator<double>_> *)
                             CONCAT44(output_format,in_stack_ffffffffffffd950),cepstrum,
                             (Buffer *)CONCAT17(in_stack_ffffffffffffd947,in_stack_ffffffffffffd940)
                            );
          if (!bVar2) {
            std::__cxx11::ostringstream::ostringstream(local_2310);
            std::operator<<((ostream *)local_2310,"Failed to run FFT cepstral analysis");
            in_stack_ffffffffffffd8b0 = (WaveformToSpectrum *)local_2331;
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)(local_2331 + 1),"fftcep",(allocator *)in_stack_ffffffffffffd8b0);
            sptk::PrintErrorMessage((string *)in_stack_ffffffffffffda90,in_stack_ffffffffffffda88);
            std::__cxx11::string::~string((string *)(local_2331 + 1));
            std::allocator<char>::~allocator((allocator<char> *)local_2331);
            local_4 = 1;
            local_1568 = 1;
            std::__cxx11::ostringstream::~ostringstream(local_2310);
            goto LAB_00106c8a;
          }
          in_stack_ffffffffffffd8af =
               sptk::WriteStream<double>
                         ((int)lVar5,(int)((ulong)this >> 0x20),sequence_to_read,
                          (ostream *)
                          CONCAT17(in_stack_ffffffffffffd8df,
                                   CONCAT16(in_stack_ffffffffffffd8de,
                                            CONCAT24(in_stack_ffffffffffffd8dc,
                                                     in_stack_ffffffffffffd8d8))),
                          in_stack_ffffffffffffd8d0);
        } while ((bool)in_stack_ffffffffffffd8af);
        std::__cxx11::ostringstream::ostringstream(local_24b0);
        std::operator<<((ostream *)local_24b0,"Failed to write FFT cepstrum");
        in_stack_ffffffffffffd8a0 = (FastFourierTransformCepstralAnalysis *)local_24d1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)(local_24d1 + 1),"fftcep",(allocator *)in_stack_ffffffffffffd8a0);
        sptk::PrintErrorMessage((string *)in_stack_ffffffffffffda90,in_stack_ffffffffffffda88);
        std::__cxx11::string::~string((string *)(local_24d1 + 1));
        std::allocator<char>::~allocator((allocator<char> *)local_24d1);
        local_4 = 1;
        local_1568 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_24b0);
LAB_00106c8a:
        std::vector<double,_std::allocator<double>_>::~vector
                  ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffd8b0);
        std::vector<double,_std::allocator<double>_>::~vector
                  ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffd8b0);
        std::vector<double,_std::allocator<double>_>::~vector
                  ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffd8b0);
      }
      else {
        std::__cxx11::ostringstream::ostringstream(local_1dc8);
        std::operator<<((ostream *)local_1dc8,
                        "Failed to initialize FastFourierTransformCepstralAnalysis");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1de8,"fftcep",&local_1de9);
        sptk::PrintErrorMessage((string *)in_stack_ffffffffffffda90,in_stack_ffffffffffffda88);
        std::__cxx11::string::~string(local_1de8);
        std::allocator<char>::~allocator((allocator<char> *)&local_1de9);
        local_4 = 1;
        local_1568 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_1dc8);
      }
      sptk::FastFourierTransformCepstralAnalysis::Buffer::~Buffer
                ((Buffer *)in_stack_ffffffffffffd8a0);
      sptk::FastFourierTransformCepstralAnalysis::~FastFourierTransformCepstralAnalysis
                (in_stack_ffffffffffffd8a0);
    }
    else {
      std::__cxx11::ostringstream::ostringstream(local_1a80);
      std::operator<<((ostream *)local_1a80,"Failed to initialize WaveformToSpectrum");
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1aa0,"fftcep",&local_1aa1);
      sptk::PrintErrorMessage((string *)in_stack_ffffffffffffda90,in_stack_ffffffffffffda88);
      std::__cxx11::string::~string(local_1aa0);
      std::allocator<char>::~allocator((allocator<char> *)&local_1aa1);
      local_4 = 1;
      local_1568 = 1;
      std::__cxx11::ostringstream::~ostringstream(local_1a80);
    }
    sptk::WaveformToSpectrum::Buffer::~Buffer((Buffer *)0x106d21);
    sptk::WaveformToSpectrum::~WaveformToSpectrum((WaveformToSpectrum *)in_stack_ffffffffffffd8a0);
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_1730);
    std::operator<<((ostream *)local_1730,"Failed to initialize SpectrumToSpectrum");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1750,"fftcep",&local_1751);
    sptk::PrintErrorMessage((string *)in_stack_ffffffffffffda90,in_stack_ffffffffffffda88);
    std::__cxx11::string::~string(local_1750);
    std::allocator<char>::~allocator((allocator<char> *)&local_1751);
    local_4 = 1;
    local_1568 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_1730);
  }
  sptk::SpectrumToSpectrum::~SpectrumToSpectrum((SpectrumToSpectrum *)in_stack_ffffffffffffd8b0);
LAB_00106d6a:
  std::ifstream::~ifstream(local_13c8);
  return local_4;
}

Assistant:

int main(int argc, char* argv[]) {
  int fft_length(kDefaultFftLength);
  int num_order(kDefaultNumOrder);
  int num_iteration(kDefaultNumIteration);
  double acceleration_factor(kDefaultAccelerationFactor);
  InputFormats input_format(kDefaultInputFormat);
  double epsilon(0.0);
  double relative_floor_in_decibels(sptk::kMin);

  for (;;) {
    const int option_char(
        getopt_long(argc, argv, "l:m:i:a:q:e:E:h", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'l': {
        if (!sptk::ConvertStringToInteger(optarg, &fft_length)) {
          std::ostringstream error_message;
          error_message << "The argument for the -l option must be an integer";
          sptk::PrintErrorMessage("fftcep", error_message);
          return 1;
        }
        break;
      }
      case 'm': {
        if (!sptk::ConvertStringToInteger(optarg, &num_order) ||
            num_order < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -m option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("fftcep", error_message);
          return 1;
        }
        break;
      }
      case 'i': {
        if (!sptk::ConvertStringToInteger(optarg, &num_iteration) ||
            num_iteration < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -i option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("fftcep", error_message);
          return 1;
        }
        break;
      }
      case 'a': {
        if (!sptk::ConvertStringToDouble(optarg, &acceleration_factor) ||
            acceleration_factor < 0.0) {
          std::ostringstream error_message;
          error_message << "The argument for the -a option must be a "
                        << "non-negative number";
          sptk::PrintErrorMessage("fftcep", error_message);
          return 1;
        }
        break;
      }
      case 'q': {
        const int min(0);
        const int max(static_cast<int>(kNumInputFormats) - 1);
        int tmp;
        if (!sptk::ConvertStringToInteger(optarg, &tmp) ||
            !sptk::IsInRange(tmp, min, max)) {
          std::ostringstream error_message;
          error_message << "The argument for the -q option must be an integer "
                        << "in the range of " << min << " to " << max;
          sptk::PrintErrorMessage("fftcep", error_message);
          return 1;
        }
        input_format = static_cast<InputFormats>(tmp);
        break;
      }
      case 'e': {
        if (!sptk::ConvertStringToDouble(optarg, &epsilon) || epsilon <= 0.0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -e option must be a positive number";
          sptk::PrintErrorMessage("fftcep", error_message);
          return 1;
        }
        break;
      }
      case 'E': {
        if (!sptk::ConvertStringToDouble(optarg, &relative_floor_in_decibels) ||
            0.0 <= relative_floor_in_decibels) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -E option must be a negative number";
          sptk::PrintErrorMessage("fftcep", error_message);
          return 1;
        }
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  const int half_fft_length(fft_length / 2);
  if (half_fft_length < num_order) {
    std::ostringstream error_message;
    error_message << "Order of cepstrum " << num_order
                  << " must be equal to or less than half of FFT length "
                  << half_fft_length;
    sptk::PrintErrorMessage("fftcep", error_message);
    return 1;
  }

  const int num_input_files(argc - optind);
  if (1 < num_input_files) {
    std::ostringstream error_message;
    error_message << "Too many input files";
    sptk::PrintErrorMessage("fftcep", error_message);
    return 1;
  }
  const char* input_file(0 == num_input_files ? NULL : argv[optind]);

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("fftcep", error_message);
    return 1;
  }

  std::ifstream ifs;
  if (NULL != input_file) {
    ifs.open(input_file, std::ios::in | std::ios::binary);
    if (ifs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << input_file;
      sptk::PrintErrorMessage("fftcep", error_message);
      return 1;
    }
  }
  std::istream& input_stream(ifs.is_open() ? ifs : std::cin);

  sptk::SpectrumToSpectrum spectrum_to_spectrum(
      fft_length,
      static_cast<sptk::SpectrumToSpectrum::InputOutputFormats>(input_format),
      sptk::SpectrumToSpectrum::InputOutputFormats::kPowerSpectrum, epsilon,
      relative_floor_in_decibels);
  if (kWaveform != input_format && !spectrum_to_spectrum.IsValid()) {
    std::ostringstream error_message;
    error_message << "Failed to initialize SpectrumToSpectrum";
    sptk::PrintErrorMessage("fftcep", error_message);
    return 1;
  }

  sptk::WaveformToSpectrum waveform_to_spectrum(
      fft_length, fft_length,
      sptk::SpectrumToSpectrum::InputOutputFormats::kPowerSpectrum, epsilon,
      relative_floor_in_decibels);
  sptk::WaveformToSpectrum::Buffer buffer_for_spectral_analysis;
  if (kWaveform == input_format && !waveform_to_spectrum.IsValid()) {
    std::ostringstream error_message;
    error_message << "Failed to initialize WaveformToSpectrum";
    sptk::PrintErrorMessage("fftcep", error_message);
    return 1;
  }

  sptk::FastFourierTransformCepstralAnalysis analysis(
      fft_length, num_order, num_iteration, acceleration_factor);
  sptk::FastFourierTransformCepstralAnalysis::Buffer
      buffer_for_cepstral_analysis;
  if (!analysis.IsValid()) {
    std::ostringstream error_message;
    error_message
        << "Failed to initialize FastFourierTransformCepstralAnalysis";
    sptk::PrintErrorMessage("fftcep", error_message);
    return 1;
  }

  const int input_length(kWaveform == input_format ? fft_length
                                                   : fft_length / 2 + 1);
  const int output_length(num_order + 1);
  std::vector<double> input(input_length);
  std::vector<double> processed_input(fft_length / 2 + 1);
  std::vector<double> output(output_length);

  while (sptk::ReadStream(false, 0, 0, input_length, &input, &input_stream,
                          NULL)) {
    if (kWaveform == input_format) {
      if (!waveform_to_spectrum.Run(input, &processed_input,
                                    &buffer_for_spectral_analysis)) {
        std::ostringstream error_message;
        error_message << "Failed to transform waveform to spectrum";
        sptk::PrintErrorMessage("fftcep", error_message);
        return 1;
      }
    } else {
      if (!spectrum_to_spectrum.Run(input, &processed_input)) {
        std::ostringstream error_message;
        error_message << "Failed to convert spectrum";
        sptk::PrintErrorMessage("fftcep", error_message);
        return 1;
      }
    }

    if (!analysis.Run(processed_input, &output,
                      &buffer_for_cepstral_analysis)) {
      std::ostringstream error_message;
      error_message << "Failed to run FFT cepstral analysis";
      sptk::PrintErrorMessage("fftcep", error_message);
      return 1;
    }

    if (!sptk::WriteStream(0, output_length, output, &std::cout, NULL)) {
      std::ostringstream error_message;
      error_message << "Failed to write FFT cepstrum";
      sptk::PrintErrorMessage("fftcep", error_message);
      return 1;
    }
  }

  return 0;
}